

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O0

void setup_vepu541_roi(Vepu541H264eRegSet *regs,HalH264eVepu541Ctx *ctx)

{
  MppEncROICfg2 *pMVar1;
  MppEncROICfg *roi_00;
  RK_U32 RVar2;
  int w_00;
  int h_00;
  RK_S32 RVar3;
  void *buf_00;
  void *buf;
  RK_S32 fd;
  RK_S32 roi_buf_size;
  RK_U32 h;
  RK_U32 w;
  MppEncROICfg *roi;
  MppEncROICfg2 *cfg;
  HalH264eVepu541Ctx *ctx_local;
  Vepu541H264eRegSet *regs_local;
  
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_roi");
  }
  if (ctx->roi_data2 == (MppEncROICfg2 *)0x0) {
    if (ctx->qpmap == (MppBuffer)0x0) {
      roi_00 = ctx->roi_data;
      w_00 = ctx->sps->pic_width_in_mbs << 4;
      h_00 = ctx->sps->pic_height_in_mbs << 4;
      if (((roi_00 == (MppEncROICfg *)0x0) || (roi_00->number == 0)) ||
         (roi_00->regions == (MppEncROIRegion *)0x0)) {
        regs->reg013 = (anon_struct_4_17_33ff386d_for_reg013)((uint)regs->reg013 & 0xfffffffd);
        (regs->reg073).roi_addr = 0;
      }
      else {
        RVar3 = vepu541_get_roi_buf_size(w_00,h_00);
        if ((ctx->roi_buf == (MppBuffer)0x0) || (RVar3 != ctx->roi_buf_size)) {
          if (ctx->roi_grp == (MppBufferGroup)0x0) {
            mpp_buffer_group_get
                      (&ctx->roi_grp,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h264e_vepu541",
                       "setup_vepu541_roi");
          }
          else if (RVar3 != ctx->roi_buf_size) {
            if (ctx->roi_buf != (MppBuffer)0x0) {
              mpp_buffer_put_with_caller(ctx->roi_buf,"setup_vepu541_roi");
              ctx->roi_buf = (MppBuffer)0x0;
            }
            mpp_buffer_group_clear(ctx->roi_grp);
          }
          if ((ctx->roi_grp == (MppBufferGroup)0x0) &&
             (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "ctx->roi_grp","setup_vepu541_roi",0x44e), (mpp_debug & 0x10000000) != 0))
          {
            abort();
          }
          if (ctx->roi_buf == (MppBuffer)0x0) {
            mpp_buffer_get_with_tag
                      (ctx->roi_grp,&ctx->roi_buf,(long)RVar3,"hal_h264e_vepu541",
                       "setup_vepu541_roi");
          }
          ctx->roi_buf_size = RVar3;
        }
        if ((ctx->roi_buf == (MppBuffer)0x0) &&
           (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "ctx->roi_buf","setup_vepu541_roi",0x456), (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        RVar2 = mpp_buffer_get_fd_with_caller(ctx->roi_buf,"setup_vepu541_roi");
        buf_00 = mpp_buffer_get_ptr_with_caller(ctx->roi_buf,"setup_vepu541_roi");
        regs->reg013 = (anon_struct_4_17_33ff386d_for_reg013)((uint)regs->reg013 & 0xfffffffd | 2);
        (regs->reg073).roi_addr = RVar2;
        vepu541_set_roi(buf_00,roi_00,w_00,h_00);
        mpp_buffer_sync_end_f(ctx->roi_buf,0,"setup_vepu541_roi");
      }
    }
    else {
      regs->reg013 = (anon_struct_4_17_33ff386d_for_reg013)((uint)regs->reg013 & 0xfffffffd | 2);
      RVar2 = mpp_buffer_get_fd_with_caller(ctx->qpmap,"setup_vepu541_roi");
      (regs->reg073).roi_addr = RVar2;
    }
  }
  else {
    pMVar1 = ctx->roi_data2;
    regs->reg013 = (anon_struct_4_17_33ff386d_for_reg013)((uint)regs->reg013 & 0xfffffffd | 2);
    RVar2 = mpp_buffer_get_fd_with_caller(pMVar1->base_cfg_buf,"setup_vepu541_roi");
    (regs->reg073).roi_addr = RVar2;
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_roi");
  }
  return;
}

Assistant:

static void setup_vepu541_roi(Vepu541H264eRegSet *regs, HalH264eVepu541Ctx *ctx)
{

    hal_h264e_dbg_func("enter\n");

    if (ctx->roi_data2) {
        MppEncROICfg2 *cfg = ( MppEncROICfg2 *)ctx->roi_data2;

        regs->reg013.roi_enc = 1;
        regs->reg073.roi_addr = mpp_buffer_get_fd(cfg->base_cfg_buf);
    } else if (ctx->qpmap) {
        regs->reg013.roi_enc = 1;
        regs->reg073.roi_addr = mpp_buffer_get_fd(ctx->qpmap);
    } else {
        MppEncROICfg *roi = ctx->roi_data;
        RK_U32 w = ctx->sps->pic_width_in_mbs * 16;
        RK_U32 h = ctx->sps->pic_height_in_mbs * 16;

        /* roi setup */
        if (roi && roi->number && roi->regions) {
            RK_S32 roi_buf_size = vepu541_get_roi_buf_size(w, h);

            if (!ctx->roi_buf || roi_buf_size != ctx->roi_buf_size) {
                if (NULL == ctx->roi_grp)
                    mpp_buffer_group_get_internal(&ctx->roi_grp, MPP_BUFFER_TYPE_ION);
                else if (roi_buf_size != ctx->roi_buf_size) {
                    if (ctx->roi_buf) {
                        mpp_buffer_put(ctx->roi_buf);
                        ctx->roi_buf = NULL;
                    }
                    mpp_buffer_group_clear(ctx->roi_grp);
                }

                mpp_assert(ctx->roi_grp);

                if (NULL == ctx->roi_buf)
                    mpp_buffer_get(ctx->roi_grp, &ctx->roi_buf, roi_buf_size);

                ctx->roi_buf_size = roi_buf_size;
            }

            mpp_assert(ctx->roi_buf);
            RK_S32 fd = mpp_buffer_get_fd(ctx->roi_buf);
            void *buf = mpp_buffer_get_ptr(ctx->roi_buf);

            regs->reg013.roi_enc = 1;
            regs->reg073.roi_addr = fd;

            vepu541_set_roi(buf, roi, w, h);
            mpp_buffer_sync_end(ctx->roi_buf);
        } else {
            regs->reg013.roi_enc = 0;
            regs->reg073.roi_addr = 0;
        }
    }

    hal_h264e_dbg_func("leave\n");
}